

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

void V_SetRndCmp(Vector *V)

{
  Real *pRVar1;
  LASErrIdType LVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    sVar4 = V_GetDim(V);
    pRVar1 = V->Cmp;
    for (uVar5 = 1; uVar5 <= sVar4; uVar5 = uVar5 + 1) {
      iVar3 = rand();
      pRVar1[uVar5] = (double)iVar3 * 4.656612873077393e-10;
    }
    V->Multipl = 1.0;
  }
  return;
}

Assistant:

void V_SetRndCmp(Vector *V)
/* set random components of the vector V */
{
    size_t Dim, Ind;
    Real *VCmp;

    if (LASResult() == LASOK) {
        Dim = V_GetDim(V);
        VCmp = V->Cmp;
        for (Ind = 1; Ind <= Dim; Ind++) {
            VCmp[Ind] = (double)rand() / ((double)RAND_MAX + 1.0);
        }
        V->Multipl = 1.0;
    }
}